

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.cpp
# Opt level: O0

void readRFA(string *fileName,adjacencyType *adjVec,startStatesType *startStates,
            finalStatesType *finalStates,int *numOfStates)

{
  bool bVar1;
  size_type sVar2;
  ulong uVar3;
  ostream *poVar4;
  undefined4 *in_R8;
  pair<std::_Rb_tree_iterator<std::pair<const_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_bool>
  pVar5;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>,_bool>
  pVar6;
  vector<edge,_std::allocator<edge>_> dummy;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>
  iter_1;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>,_bool>
  emplaceResult_1;
  vector<int,_std::allocator<int>_> states_1;
  _Rb_tree_iterator<std::pair<const_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  iter;
  pair<std::_Rb_tree_iterator<std::pair<const_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_bool>
  emplaceResult;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  states;
  int numOfStateInDef;
  string label;
  smatch res;
  regex numberInStateDefRegex;
  regex hasLabel;
  regex isFinal;
  regex isStart;
  regex ruleRegex;
  string curString;
  ifstream fileStream;
  size_t *in_stack_fffffffffffffac8;
  string *in_stack_fffffffffffffad0;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> *this;
  value_type *in_stack_fffffffffffffad8;
  value_type *in_stack_fffffffffffffae0;
  undefined7 in_stack_fffffffffffffae8;
  undefined1 in_stack_fffffffffffffaef;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>
  in_stack_fffffffffffffaf0;
  ifstream *in_stack_fffffffffffffaf8;
  flag_type in_stack_fffffffffffffb04;
  string *in_stack_fffffffffffffb08;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> *in_stack_fffffffffffffb10;
  undefined1 local_4a9 [33];
  _Base_ptr local_488;
  undefined1 local_480;
  _Base_ptr local_478;
  undefined1 local_470;
  _Base_ptr local_448;
  _Base_ptr local_440;
  undefined1 local_438;
  _Base_ptr local_430;
  undefined1 local_428;
  string local_400 [32];
  string local_3e0 [36];
  int local_3bc;
  string local_3b8 [111];
  char in_stack_fffffffffffffcb7;
  string *in_stack_fffffffffffffcb8;
  string local_2b8 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_298;
  vector<edge,_std::allocator<edge>_> *in_stack_fffffffffffffd80;
  string *in_stack_fffffffffffffd88;
  uint in_stack_fffffffffffffd94;
  adjacencyType *in_stack_fffffffffffffd98;
  ifstream *in_stack_fffffffffffffda0;
  string local_250 [32];
  istream local_230 [520];
  undefined4 *local_28;
  
  local_28 = in_R8;
  anon_unknown.dwarf_29c37::openFile(in_stack_fffffffffffffb08);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            (in_stack_fffffffffffffb10,(char *)in_stack_fffffffffffffb08,in_stack_fffffffffffffb04);
  anon_unknown.dwarf_29c37::skipUntilRegex
            (in_stack_fffffffffffffaf8,(regex *)in_stack_fffffffffffffaf0._M_node);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)in_stack_fffffffffffffad0);
  anon_unknown.dwarf_29c37::split(in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb7);
  sVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(&local_298);
  *local_28 = (int)sVar2;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_fffffffffffffae0);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            (in_stack_fffffffffffffb10,(char *)in_stack_fffffffffffffb08,in_stack_fffffffffffffb04);
  anon_unknown.dwarf_29c37::skipUntilRegex
            (in_stack_fffffffffffffaf8,(regex *)in_stack_fffffffffffffaf0._M_node);
  std::__cxx11::string::operator=(local_250,local_2b8);
  std::__cxx11::string::~string(local_2b8);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)in_stack_fffffffffffffad0);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            (in_stack_fffffffffffffb10,(char *)in_stack_fffffffffffffb08,in_stack_fffffffffffffb04);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            (in_stack_fffffffffffffb10,(char *)in_stack_fffffffffffffb08,in_stack_fffffffffffffb04);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            (in_stack_fffffffffffffb10,(char *)in_stack_fffffffffffffb08,in_stack_fffffffffffffb04);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            (in_stack_fffffffffffffb10,(char *)in_stack_fffffffffffffb08,in_stack_fffffffffffffb04);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            (in_stack_fffffffffffffb10,(char *)in_stack_fffffffffffffb08,in_stack_fffffffffffffb04);
  std::__cxx11::
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::match_results((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   *)in_stack_fffffffffffffad0);
  std::__cxx11::string::string(local_3b8);
  do {
    bVar1 = std::
            regex_search<std::char_traits<char>,std::allocator<char>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffffaf0._M_node,
                       (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        *)CONCAT17(in_stack_fffffffffffffaef,in_stack_fffffffffffffae8),
                       (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
                       in_stack_fffffffffffffae0,
                       (match_flag_type)((ulong)in_stack_fffffffffffffad8 >> 0x20));
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      this = (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_4a9;
      std::allocator<edge>::allocator((allocator<edge> *)0x107219);
      std::vector<edge,_std::allocator<edge>_>::vector
                ((vector<edge,_std::allocator<edge>_> *)in_stack_fffffffffffffaf0._M_node,
                 CONCAT17(in_stack_fffffffffffffaef,in_stack_fffffffffffffae8),
                 (allocator_type *)in_stack_fffffffffffffae0);
      std::allocator<edge>::~allocator((allocator<edge> *)0x10723e);
      anon_unknown.dwarf_29c37::readEdges
                (in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,in_stack_fffffffffffffd94,
                 in_stack_fffffffffffffd88,in_stack_fffffffffffffd80);
      std::ifstream::close();
      std::vector<edge,_std::allocator<edge>_>::~vector
                ((vector<edge,_std::allocator<edge>_> *)in_stack_fffffffffffffae0);
      std::__cxx11::string::~string(local_3b8);
      std::__cxx11::
      match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::~match_results((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        *)0x1072a5);
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(this);
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(this);
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(this);
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(this);
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(this);
      std::__cxx11::string::~string(local_250);
      std::ifstream::~ifstream(local_230);
      return;
    }
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      bVar1 = std::
              regex_search<std::char_traits<char>,std::allocator<char>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffffaf0._M_node,
                         (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          *)CONCAT17(in_stack_fffffffffffffaef,in_stack_fffffffffffffae8),
                         (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
                         in_stack_fffffffffffffae0,
                         (match_flag_type)((ulong)in_stack_fffffffffffffad8 >> 0x20));
      if (!bVar1) {
        poVar4 = std::operator<<((ostream *)&std::cout,
                                 "Incorrect format of state definition, expected X[label=\"Y\", ...], got "
                                );
        poVar4 = std::operator<<(poVar4,local_250);
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        exit(1);
      }
      std::__cxx11::
      match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::str((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             *)in_stack_fffffffffffffad8,(size_type)in_stack_fffffffffffffad0);
      local_3bc = std::__cxx11::stoi(in_stack_fffffffffffffad0,in_stack_fffffffffffffac8,0);
      std::__cxx11::string::~string(local_3e0);
      bVar1 = std::
              regex_search<std::char_traits<char>,std::allocator<char>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffffaf0._M_node,
                         (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          *)CONCAT17(in_stack_fffffffffffffaef,in_stack_fffffffffffffae8),
                         (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
                         in_stack_fffffffffffffae0,
                         (match_flag_type)((ulong)in_stack_fffffffffffffad8 >> 0x20));
      if (!bVar1) {
        poVar4 = std::operator<<((ostream *)&std::cout,"Expected label= in string ");
        poVar4 = std::operator<<(poVar4,local_250);
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        exit(1);
      }
      std::__cxx11::
      match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::str((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             *)in_stack_fffffffffffffad8,(size_type)in_stack_fffffffffffffad0);
      std::__cxx11::string::operator=(local_3b8,local_400);
      std::__cxx11::string::~string(local_400);
      bVar1 = std::
              regex_search<std::char_traits<char>,std::allocator<char>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffffaf0._M_node,
                         (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          *)CONCAT17(in_stack_fffffffffffffaef,in_stack_fffffffffffffae8),
                         (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
                         in_stack_fffffffffffffae0,
                         (match_flag_type)((ulong)in_stack_fffffffffffffad8 >> 0x20));
      if (bVar1) {
        std::
        allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)0x106f03);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_fffffffffffffaf0._M_node,
                 CONCAT17(in_stack_fffffffffffffaef,in_stack_fffffffffffffae8),
                 in_stack_fffffffffffffae0,(allocator_type *)in_stack_fffffffffffffad8);
        std::
        allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)0x106f31);
        pVar5 = std::
                map<int,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
                ::
                emplace<int&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&>
                          ((map<int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                            *)in_stack_fffffffffffffae0,(int *)in_stack_fffffffffffffad8,
                           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)in_stack_fffffffffffffad0);
        local_440 = (_Base_ptr)pVar5.first._M_node;
        local_438 = pVar5.second;
        local_430 = local_440;
        local_428 = local_438;
        if (((undefined1  [16])pVar5 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          local_448 = local_440;
          std::
          _Rb_tree_iterator<std::pair<const_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ::operator*((_Rb_tree_iterator<std::pair<const_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                       *)0x106fba);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)in_stack_fffffffffffffae0,in_stack_fffffffffffffad8);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_fffffffffffffae0);
      }
      bVar1 = std::
              regex_search<std::char_traits<char>,std::allocator<char>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffffaf0._M_node,
                         (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          *)CONCAT17(in_stack_fffffffffffffaef,in_stack_fffffffffffffae8),
                         (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
                         in_stack_fffffffffffffae0,
                         (match_flag_type)((ulong)in_stack_fffffffffffffad8 >> 0x20));
      if (bVar1) {
        std::allocator<int>::allocator((allocator<int> *)0x10706f);
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffaf0._M_node,
                   CONCAT17(in_stack_fffffffffffffaef,in_stack_fffffffffffffae8),
                   (value_type_conflict3 *)in_stack_fffffffffffffae0,
                   (allocator_type *)in_stack_fffffffffffffad8);
        std::allocator<int>::~allocator((allocator<int> *)0x10709d);
        pVar6 = std::
                map<std::__cxx11::string,std::vector<int,std::allocator<int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<int,std::allocator<int>>>>>
                ::emplace<std::__cxx11::string&,std::vector<int,std::allocator<int>>&>
                          ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                            *)in_stack_fffffffffffffae0,in_stack_fffffffffffffad8,
                           (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffad0);
        in_stack_fffffffffffffaf0 = pVar6.first._M_node;
        in_stack_fffffffffffffaef = pVar6.second;
        local_488 = in_stack_fffffffffffffaf0._M_node;
        local_480 = in_stack_fffffffffffffaef;
        local_478 = in_stack_fffffffffffffaf0._M_node;
        local_470 = in_stack_fffffffffffffaef;
        if (((undefined1  [16])pVar6 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          local_4a9._25_8_ = in_stack_fffffffffffffaf0._M_node;
          std::
          _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>
          ::operator*((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>
                       *)0x107126);
          std::vector<int,_std::allocator<int>_>::push_back
                    ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffae0,
                     (value_type_conflict3 *)in_stack_fffffffffffffad8);
        }
        std::vector<int,_std::allocator<int>_>::~vector
                  ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffae0);
      }
    }
    std::getline<char,std::char_traits<char>,std::allocator<char>>(local_230,local_250);
  } while( true );
}

Assistant:

void readRFA(const string & fileName,
             adjacencyType & adjVec,
             startStatesType & startStates,
             finalStatesType & finalStates,
             int & numOfStates)
{
    ifstream fileStream = openFile(fileName);

    // get number of states
    string curString = skipUntilRegex(fileStream, regex("[0-9]+"));
    numOfStates = static_cast<int>(split(curString, ';').size());

    // parse info about start and final states
    curString = skipUntilRegex(fileStream, regex("([0-9]+)([[])"));

    regex ruleRegex ("(->)");
    regex isStart ("(color=)");
    regex isFinal ("(shape=)");
    regex hasLabel ("(label=\")([^\"]+)");
    regex numberInStateDefRegex ("([0-9]+)");
    smatch res;
    string label;
    int numOfStateInDef;

    while ( ! regex_search(curString, res, ruleRegex)) {
        if ( ! curString.empty()) {
            if (regex_search(curString, res, numberInStateDefRegex)) {
                numOfStateInDef = stoi(res.str(1));
            } else {
                cout << "Incorrect format of state definition, expected X[label=\"Y\", ...], got "
                     << curString << endl;
                exit(1);
            }

            if (regex_search(curString, res, hasLabel)) {
                label = res.str(2);
                // this map state -> nonterminal
                if (regex_search(curString, res, isStart)) {
                    auto states = vector<string>(1, label);
                    auto emplaceResult = startStates.emplace(numOfStateInDef, states);
                    if ( ! emplaceResult.second) {
                        auto iter = emplaceResult.first;
                        (*iter).second.push_back(label);
                    }
                }

                // this map nonterminal -> state
                if (regex_search(curString, res, isFinal)) {
                    auto states = vector<int>(1, numOfStateInDef);
                    auto emplaceResult = finalStates.emplace(label, states);
                    if ( ! emplaceResult.second) {
                        auto iter = emplaceResult.first;
                        (*iter).second.push_back(numOfStateInDef);
                    }
                }
            } else {
                cout << "Expected label= in string " << curString << endl;
                exit(1);
            }
        }
        getline(fileStream, curString);
    }
    vector<edge> dummy = vector<edge>(0);
    readEdges(fileStream, adjVec, static_cast<unsigned int>(numOfStates), curString, dummy);
    fileStream.close();
}